

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

uint Kit_SopCommonCube(Kit_Sop_t *cSop)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)cSop->nCubes;
  if (cSop->nCubes < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0xffffffff;
  for (; (uVar2 != uVar3 && (cSop->pCubes[uVar3] != 0)); uVar3 = uVar3 + 1) {
    uVar1 = uVar1 & cSop->pCubes[uVar3];
  }
  return uVar1;
}

Assistant:

static inline unsigned Kit_SopCommonCube( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = ~(unsigned)0;
    Kit_SopForEachCube( cSop, uCube, i )
        uMask &= uCube;
    return uMask;
}